

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O2

void get_wall_for_db(int *x,int *y)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *x;
  iVar2 = *y;
  switch(*(uint *)&level->locations[iVar1][iVar2].field_0x6 >> 4 & 3) {
  case 0:
    iVar2 = iVar2 + -1;
    break;
  case 1:
    iVar2 = iVar2 + 1;
    break;
  case 2:
    iVar1 = iVar1 + 1;
    goto LAB_0015c337;
  case 3:
    iVar1 = iVar1 + -1;
LAB_0015c337:
    *x = iVar1;
    return;
  }
  *y = iVar2;
  return;
}

Assistant:

static void get_wall_for_db(int *x, int *y)
{
	switch (level->locations[*x][*y].drawbridgemask & DB_DIR) {
		case DB_NORTH: (*y)--; break;
		case DB_SOUTH: (*y)++; break;
		case DB_EAST:  (*x)++; break;
		case DB_WEST:  (*x)--; break;
	}
}